

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_debug.c
# Opt level: O0

int lj_debug_getinfo(lua_State *L,char *what,lj_Debug *ar,int ext)

{
  int iVar1;
  int iVar2;
  uint *puVar3;
  undefined4 *puVar4;
  bool bVar5;
  bool bVar6;
  uint uVar7;
  GCtab *pGVar8;
  ulong uVar9;
  int in_ECX;
  char *pcVar10;
  ulong uVar11;
  long in_RDX;
  char *in_RSI;
  long in_RDI;
  BCLine line;
  MSize szl;
  MSize i;
  int sz;
  BCLine first;
  void *lineinfo;
  GCproto *pt_2;
  GCtab *t;
  GCproto *pt_1;
  GCstr *name;
  BCLine firstline;
  GCproto *pt;
  uint32_t size;
  uint32_t offset;
  TValue *func;
  GCfunc *fn;
  TValue *nextframe;
  TValue *frame;
  int opt_L;
  int opt_f;
  uint32_t in_stack_fffffffffffffeb0;
  uint32_t in_stack_fffffffffffffeb4;
  TValue *in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffec0;
  uint in_stack_fffffffffffffec4;
  undefined4 in_stack_fffffffffffffec8;
  uint uVar12;
  undefined4 in_stack_fffffffffffffecc;
  int local_130;
  char **in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  BCLine in_stack_fffffffffffffee4;
  undefined3 uVar13;
  uint in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  uint local_10c;
  ulong local_b8;
  uint *local_a8;
  char *local_88;
  
  bVar5 = false;
  bVar6 = false;
  local_a8 = (uint *)0x0;
  if (*in_RSI == '>') {
    uVar12 = *(uint *)(*(long *)(in_RDI + 0x18) + -8);
    *(long *)(in_RDI + 0x18) = *(long *)(in_RDI + 0x18) + -8;
    local_88 = in_RSI + 1;
  }
  else {
    local_a8 = (uint *)((ulong)*(uint *)(in_RDI + 0x24) +
                       (ulong)(*(uint *)(in_RDX + 0x74) & 0xffff) * 8);
    uVar12 = *local_a8;
    local_88 = in_RSI;
  }
  local_b8 = (ulong)uVar12;
  do {
    if (*local_88 == '\0') {
      if (bVar5) {
        puVar3 = *(uint **)(in_RDI + 0x18);
        *puVar3 = uVar12;
        puVar3[1] = 0xfffffff7;
        uVar11 = *(long *)(in_RDI + 0x18) + 8;
        *(ulong *)(in_RDI + 0x18) = uVar11;
        if (*(uint *)(in_RDI + 0x20) <= uVar11) {
          lj_state_growstack1((lua_State *)0x111b92);
        }
      }
      if (bVar6) {
        if (*(char *)(local_b8 + 6) == '\0') {
          pGVar8 = lj_tab_new((lua_State *)&in_stack_fffffffffffffeb8->field_2,
                              in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0);
          uVar11 = (ulong)*(uint *)(local_b8 + 0x10);
          uVar9 = (ulong)*(uint *)(uVar11 - 0xc);
          if (uVar9 != 0) {
            iVar1 = *(int *)(uVar11 - 0x14);
            if (*(int *)(uVar11 - 0x10) < 0x100) {
              local_130 = 1;
            }
            else {
              local_130 = 4;
              if (*(int *)(uVar11 - 0x10) < 0x10000) {
                local_130 = 2;
              }
            }
            iVar2 = *(int *)(uVar11 - 0x38);
            for (local_10c = 0; local_10c < iVar2 - 1U; local_10c = local_10c + 1) {
              if (local_130 == 1) {
                uVar12 = (uint)*(byte *)(uVar9 + local_10c);
              }
              else if (local_130 == 2) {
                in_stack_fffffffffffffec4 = (uint)*(ushort *)(uVar9 + (ulong)local_10c * 2);
                uVar12 = in_stack_fffffffffffffec4;
              }
              else {
                in_stack_fffffffffffffec4 = *(uint *)(uVar9 + (ulong)local_10c * 4);
                uVar12 = in_stack_fffffffffffffec4;
              }
              uVar7 = iVar1 + uVar12;
              if (uVar7 < pGVar8->asize) {
                in_stack_fffffffffffffeb8 =
                     (TValue *)((ulong)(pGVar8->array).ptr32 + (long)(int)uVar7 * 8);
              }
              else {
                in_stack_fffffffffffffeb8 =
                     lj_tab_setinth((lua_State *)CONCAT44(iVar1,uVar12),
                                    (GCtab *)CONCAT44(in_stack_fffffffffffffec4,
                                                      in_stack_fffffffffffffec0),
                                    (int32_t)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
              }
              (in_stack_fffffffffffffeb8->field_2).it = 0xfffffffd;
            }
          }
          puVar4 = *(undefined4 **)(in_RDI + 0x18);
          *puVar4 = (int)pGVar8;
          puVar4[1] = 0xfffffff4;
        }
        else {
          *(undefined4 *)(*(long *)(in_RDI + 0x18) + 4) = 0xffffffff;
        }
        uVar11 = *(long *)(in_RDI + 0x18) + 8;
        *(ulong *)(in_RDI + 0x18) = uVar11;
        if (*(uint *)(in_RDI + 0x20) <= uVar11) {
          lj_state_growstack1((lua_State *)0x111e17);
        }
      }
      return 1;
    }
    if (*local_88 == 'S') {
      if (*(char *)(local_b8 + 6) == '\0') {
        uVar11 = (ulong)*(uint *)(local_b8 + 0x10);
        iVar1 = *(int *)(uVar11 - 0x14);
        *(ulong *)(in_RDX + 0x20) = (ulong)*(uint *)(uVar11 - 0x18) + 0x10;
        lj_debug_shortname((char *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                           (GCstr *)&in_stack_fffffffffffffeb8->field_2);
        *(int *)(in_RDX + 0x30) = iVar1;
        *(int *)(in_RDX + 0x34) = iVar1 + *(int *)(uVar11 - 0x10);
        uVar13 = (undefined3)in_stack_fffffffffffffee8;
        in_stack_fffffffffffffee8 = CONCAT13(1,uVar13);
        if (iVar1 == 0) {
          in_stack_fffffffffffffee8 = CONCAT13(*(int *)(uVar11 - 0x10) != 0,uVar13) ^ 0xff000000;
        }
        pcVar10 = "main";
        if ((in_stack_fffffffffffffee8 & 0x1000000) != 0) {
          pcVar10 = "Lua";
        }
        *(char **)(in_RDX + 0x18) = pcVar10;
      }
      else {
        *(char **)(in_RDX + 0x20) = "=[C]";
        *(undefined1 *)(in_RDX + 0x38) = 0x5b;
        *(undefined1 *)(in_RDX + 0x39) = 0x43;
        *(undefined1 *)(in_RDX + 0x3a) = 0x5d;
        *(undefined1 *)(in_RDX + 0x3b) = 0;
        *(undefined4 *)(in_RDX + 0x30) = 0xffffffff;
        *(undefined4 *)(in_RDX + 0x34) = 0xffffffff;
        *(char **)(in_RDX + 0x18) = "C";
      }
    }
    else if (*local_88 == 'l') {
      if (local_a8 == (uint *)0x0) {
        in_stack_fffffffffffffee4 = -1;
      }
      else {
        in_stack_fffffffffffffee4 =
             debug_frameline((lua_State *)
                             CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                             (GCfunc *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0)
                             ,in_stack_fffffffffffffeb8);
      }
      *(BCLine *)(in_RDX + 0x28) = in_stack_fffffffffffffee4;
    }
    else if (*local_88 == 'u') {
      *(uint *)(in_RDX + 0x2c) = (uint)*(byte *)(local_b8 + 7);
      if (in_ECX != 0) {
        if (*(char *)(local_b8 + 6) == '\0') {
          uVar7 = *(uint *)(local_b8 + 0x10);
          *(uint *)(in_RDX + 0x78) = (uint)*(byte *)((ulong)uVar7 - 0x3a);
          *(uint *)(in_RDX + 0x7c) = (uint)((*(byte *)((ulong)uVar7 - 0x1b) & 2) != 0);
        }
        else {
          *(undefined4 *)(in_RDX + 0x78) = 0;
          *(undefined4 *)(in_RDX + 0x7c) = 1;
        }
      }
    }
    else if (*local_88 == 'n') {
      if (local_a8 == (uint *)0x0) {
        in_stack_fffffffffffffed8 = (char **)0x0;
      }
      else {
        in_stack_fffffffffffffed8 =
             (char **)lj_debug_funcname((lua_State *)
                                        CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8
                                                ),
                                        (TValue *)
                                        CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0
                                                ),in_stack_fffffffffffffed8);
      }
      *(char ***)(in_RDX + 0x10) = in_stack_fffffffffffffed8;
      if (*(long *)(in_RDX + 0x10) == 0) {
        *(char **)(in_RDX + 0x10) = "";
        *(undefined8 *)(in_RDX + 8) = 0;
      }
    }
    else if (*local_88 == 'f') {
      bVar5 = true;
    }
    else {
      if (*local_88 != 'L') {
        return 0;
      }
      bVar6 = true;
    }
    local_88 = local_88 + 1;
  } while( true );
}

Assistant:

int lj_debug_getinfo(lua_State *L, const char *what, lj_Debug *ar, int ext)
{
  int opt_f = 0, opt_L = 0;
  TValue *frame = NULL;
  TValue *nextframe = NULL;
  GCfunc *fn;
  if (*what == '>') {
    TValue *func = L->top - 1;
    api_check(L, tvisfunc(func));
    fn = funcV(func);
    L->top--;
    what++;
  } else {
    uint32_t offset = (uint32_t)ar->i_ci & 0xffff;
    uint32_t size = (uint32_t)ar->i_ci >> 16;
    lua_assert(offset != 0);
    frame = tvref(L->stack) + offset;
    if (size) nextframe = frame + size;
    lua_assert(frame <= tvref(L->maxstack) &&
	       (!nextframe || nextframe <= tvref(L->maxstack)));
    fn = frame_func(frame);
    lua_assert(fn->c.gct == ~LJ_TFUNC);
  }
  for (; *what; what++) {
    if (*what == 'S') {
      if (isluafunc(fn)) {
	GCproto *pt = funcproto(fn);
	BCLine firstline = pt->firstline;
	GCstr *name = proto_chunkname(pt);
	ar->source = strdata(name);
	lj_debug_shortname(ar->short_src, name);
	ar->linedefined = (int)firstline;
	ar->lastlinedefined = (int)(firstline + pt->numline);
	ar->what = (firstline || !pt->numline) ? "Lua" : "main";
      } else {
	ar->source = "=[C]";
	ar->short_src[0] = '[';
	ar->short_src[1] = 'C';
	ar->short_src[2] = ']';
	ar->short_src[3] = '\0';
	ar->linedefined = -1;
	ar->lastlinedefined = -1;
	ar->what = "C";
      }
    } else if (*what == 'l') {
      ar->currentline = frame ? debug_frameline(L, fn, nextframe) : -1;
    } else if (*what == 'u') {
      ar->nups = fn->c.nupvalues;
      if (ext) {
	if (isluafunc(fn)) {
	  GCproto *pt = funcproto(fn);
	  ar->nparams = pt->numparams;
	  ar->isvararg = !!(pt->flags & PROTO_VARARG);
	} else {
	  ar->nparams = 0;
	  ar->isvararg = 1;
	}
      }
    } else if (*what == 'n') {
      ar->namewhat = frame ? lj_debug_funcname(L, frame, &ar->name) : NULL;
      if (ar->namewhat == NULL) {
	ar->namewhat = "";
	ar->name = NULL;
      }
    } else if (*what == 'f') {
      opt_f = 1;
    } else if (*what == 'L') {
      opt_L = 1;
    } else {
      return 0;  /* Bad option. */
    }
  }
  if (opt_f) {
    setfuncV(L, L->top, fn);
    incr_top(L);
  }
  if (opt_L) {
    if (isluafunc(fn)) {
      GCtab *t = lj_tab_new(L, 0, 0);
      GCproto *pt = funcproto(fn);
      const void *lineinfo = proto_lineinfo(pt);
      if (lineinfo) {
	BCLine first = pt->firstline;
	int sz = pt->numline < 256 ? 1 : pt->numline < 65536 ? 2 : 4;
	MSize i, szl = pt->sizebc-1;
	for (i = 0; i < szl; i++) {
	  BCLine line = first +
	    (sz == 1 ? (BCLine)((const uint8_t *)lineinfo)[i] :
	     sz == 2 ? (BCLine)((const uint16_t *)lineinfo)[i] :
	     (BCLine)((const uint32_t *)lineinfo)[i]);
	  setboolV(lj_tab_setint(L, t, line), 1);
	}
      }
      settabV(L, L->top, t);
    } else {
      setnilV(L->top);
    }
    incr_top(L);
  }
  return 1;  /* Ok. */
}